

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O1

Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> __thiscall
kj::TlsNetwork::parseAddress(TlsNetwork *this,StringPtr addr,uint portHint)

{
  undefined8 *puVar1;
  ArrayDisposer *pAVar2;
  ArrayDisposer *pAVar3;
  OwnPromiseNode node;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  undefined4 in_register_0000000c;
  long *value;
  char *__dest;
  undefined4 in_R8D;
  ulong __n;
  size_t sVar7;
  String hostname;
  String result;
  OwnPromiseNode local_50;
  StringPtr addr_local;
  _func_int **local_38;
  void *continuationTracePtr;
  
  addr_local.content.size_ = CONCAT44(in_register_0000000c,portHint);
  value = (long *)addr.content.size_;
  __n = addr_local.content.size_ - 1;
  addr_local.content.ptr = (char *)value;
  if ((__n == 0) || ((char)*value != '[')) {
    if (((4 < __n) && (*(char *)((long)value + 4) == ':' && (int)*value == 0x78696e75)) ||
       ((0xd < __n &&
        (*(long *)((long)value + 6) == 0x3a74636172747362 && *value == 0x7362612d78696e75)))) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[47],kj::StringPtr&>
                ((Fault *)&result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
                 ,0x2ae,FAILED,(char *)0x0,
                 "\"can\'t authenticate Unix domain socket with TLS\", addr",
                 (char (*) [47])"can\'t authenticate Unix domain socket with TLS",&addr_local);
      kj::_::Debug::Fault::fatal((Fault *)&result);
    }
    if ((long *)((long)value + (addr_local.content.size_ - 1)) != value) {
      uVar5 = 0;
      uVar6 = 0;
      do {
        uVar6 = uVar6 + (*(char *)((long)value + uVar5) == ':');
        uVar5 = uVar5 + 1;
      } while (__n != uVar5);
      if (1 < uVar6) {
        heapString(&result,(char *)value,__n);
        goto LAB_004a3a20;
      }
    }
    pvVar4 = memchr(value,0x3a,__n);
    if (pvVar4 == (void *)0x0) {
      heapString(&result,(char *)value,__n);
    }
    else {
      heapString(&result,(char *)value,(long)pvVar4 - (long)value);
    }
  }
  else {
    pvVar4 = memchr(value,0x5d,__n);
    if (pvVar4 == (void *)0x0) {
      heapString(&result,(char *)value,__n);
    }
    else {
      sVar7 = ~(ulong)value + (long)pvVar4;
      heapString(&result,sVar7);
      if (sVar7 != 0) {
        __dest = (char *)result.content.size_;
        if (result.content.size_ != 0) {
          __dest = result.content.ptr;
        }
        memcpy(__dest,(void *)((long)value + 1),sVar7);
      }
    }
  }
LAB_004a3a20:
  pAVar3 = result.content.disposer;
  pAVar2 = (ArrayDisposer *)result.content.size_;
  puVar1 = *(undefined8 **)(addr.content.ptr + 0x10);
  (**(code **)*puVar1)(&local_50,puVar1,addr_local.content.ptr,addr_local.content.size_,in_R8D);
  result.content.size_ = (size_t)result.content.ptr;
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:716:15)>
       ::anon_class_32_2_2106826e_for_func::operator();
  result.content.ptr = addr.content.ptr;
  result.content.disposer = pAVar2;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,decltype(nullptr)>,kj::TlsNetwork::parseAddress(kj::StringPtr,unsigned_int)::_lambda(kj::Own<kj::NetworkAddress,decltype(nullptr)>&&)_1_>,kj::_::PromiseDisposer,kj::TlsNetwork::parseAddress(kj::StringPtr,unsigned_int)::_lambda(kj::Own<kj::NetworkAddress,decltype(nullptr)>&&)_1_,void*&>
            ((PromiseDisposer *)&local_38,&local_50,(anon_class_32_2_2106826e_for_func *)&result,
             &continuationTracePtr);
  pAVar2 = result.content.disposer;
  sVar7 = result.content.size_;
  (this->super_Network)._vptr_Network = local_38;
  if (result.content.size_ != 0) {
    result.content.size_ = 0;
    result.content.disposer = (ArrayDisposer *)0x0;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,sVar7,1,pAVar2,pAVar2,0,0,0);
  }
  node.ptr = local_50.ptr;
  if (&(local_50.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_50.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<Own<NetworkAddress>> parseAddress(StringPtr addr, uint portHint) override {
    // We want to parse the hostname or IP address out of `addr`. This is a bit complicated as
    // KJ's default network implementation has a fairly featureful grammar for these things.
    // In particular, we cannot just split on ':' because the address might be IPv6.

    kj::String hostname;

    if (addr.startsWith("[")) {
      // IPv6, like "[1234:5678::abcd]:123". Take the part between the brackets.
      KJ_IF_SOME(pos, addr.findFirst(']')) {
        hostname = kj::str(addr.slice(1, pos));
      } else {
        // Uhh??? Just take the whole thing, cert will fail later.
        hostname = kj::heapString(addr);
      }
    }